

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_manager.cpp
# Opt level: O2

void __thiscall duckdb::MetadataManager::MarkBlocksAsModified(MetadataManager *this)

{
  _Hash_node_base *p_Var1;
  _Hash_node_base *in_RAX;
  iterator __it;
  idx_t iVar2;
  ulong free_list;
  mapped_type *pmVar3;
  __node_base *p_Var4;
  __node_base *p_Var5;
  long block_id;
  _Hash_node_base *local_38;
  
  p_Var5 = &(this->modified_blocks)._M_h._M_before_begin;
  local_38 = in_RAX;
  while (p_Var5 = p_Var5->_M_nxt, p_Var5 != (__node_base *)0x0) {
    local_38 = p_Var5[1]._M_nxt;
    p_Var1 = *(_Hash_node_base **)&((_Prime_rehash_policy *)(p_Var5 + 2))->_M_max_load_factor;
    __it = ::std::
           _Hashtable<long,_std::pair<const_long,_duckdb::MetadataBlock>,_std::allocator<std::pair<const_long,_duckdb::MetadataBlock>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&(this->blocks)._M_h,(key_type_conflict *)&local_38);
    iVar2 = MetadataBlock::FreeBlocksToInteger
                      ((MetadataBlock *)
                       ((long)__it.
                              super__Node_iterator_base<std::pair<const_long,_duckdb::MetadataBlock>,_false>
                              ._M_cur + 0x10));
    free_list = iVar2 | (ulong)p_Var1;
    if (free_list == 0xffffffffffffffff) {
      ::std::
      _Hashtable<long,_std::pair<const_long,_duckdb::MetadataBlock>,_std::allocator<std::pair<const_long,_duckdb::MetadataBlock>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
      ::erase(&(this->blocks)._M_h,
              (const_iterator)
              __it.super__Node_iterator_base<std::pair<const_long,_duckdb::MetadataBlock>,_false>.
              _M_cur);
      (*this->block_manager->_vptr_BlockManager[9])(this->block_manager,local_38);
    }
    else {
      MetadataBlock::FreeBlocksFromInteger
                ((MetadataBlock *)
                 ((long)__it.
                        super__Node_iterator_base<std::pair<const_long,_duckdb::MetadataBlock>,_false>
                        ._M_cur + 0x10),free_list);
    }
  }
  ::std::
  _Hashtable<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->modified_blocks)._M_h);
  p_Var4 = &(this->blocks)._M_h._M_before_begin;
  while (p_Var4 = p_Var4->_M_nxt, p_Var4 != (__node_base *)0x0) {
    iVar2 = MetadataBlock::FreeBlocksToInteger((MetadataBlock *)(p_Var4 + 2));
    pmVar3 = ::std::__detail::
             _Map_base<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<long,_std::pair<const_long,_unsigned_long>,_std::allocator<std::pair<const_long,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<long>,_std::hash<long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->modified_blocks,(key_type *)(p_Var4 + 4));
    *pmVar3 = ~iVar2;
  }
  return;
}

Assistant:

void MetadataManager::MarkBlocksAsModified() {
	// for any blocks that were modified in the last checkpoint - set them to free blocks currently
	for (auto &kv : modified_blocks) {
		auto block_id = kv.first;
		idx_t modified_list = kv.second;
		auto entry = blocks.find(block_id);
		D_ASSERT(entry != blocks.end());
		auto &block = entry->second;
		idx_t current_free_blocks = block.FreeBlocksToInteger();
		// merge the current set of free blocks with the modified blocks
		idx_t new_free_blocks = current_free_blocks | modified_list;
		if (new_free_blocks == NumericLimits<idx_t>::Maximum()) {
			// if new free_blocks is all blocks - mark entire block as modified
			blocks.erase(entry);
			block_manager.MarkBlockAsModified(block_id);
		} else {
			// set the new set of free blocks
			block.FreeBlocksFromInteger(new_free_blocks);
		}
	}

	modified_blocks.clear();
	for (auto &kv : blocks) {
		auto &block = kv.second;
		idx_t free_list = block.FreeBlocksToInteger();
		idx_t occupied_list = ~free_list;
		modified_blocks[block.block_id] = occupied_list;
	}
}